

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

shared_ptr<duckdb::ColumnDataCollection,_true> __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::shared_ptr<duckdb::ColumnDataCollection,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined6 in_register_00000032;
  long *plVar3;
  type tVar4;
  shared_ptr<duckdb::ColumnDataCollection,_true> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  plVar3 = (long *)CONCAT62(in_register_00000032,field_id);
  cVar1 = (**(code **)(*plVar3 + 0x20))(plVar3,(ulong)tag & 0xffffffff);
  if (cVar1 == '\0') {
    (**(code **)(*plVar3 + 0x28))(plVar3,0);
    this->_vptr_Deserializer = (_func_int **)0x0;
    local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&this->deserialize_enum_from_string = 0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    tVar4 = Read<duckdb::shared_ptr<duckdb::ColumnDataCollection,true>>(this);
    (**(code **)(*plVar3 + 0x28))
              (plVar3,1,tVar4.internal.
                        super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX;
  }
  sVar5.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<duckdb::ColumnDataCollection,_true>)
         sVar5.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}